

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void google::protobuf::compiler::objectivec::StringPieceTrimWhitespace(StringPiece *input)

{
  byte bVar1;
  long lVar2;
  
  while (((lVar2 = input->length_, lVar2 != 0 && ((ulong)(byte)*input->ptr_ < 0x21)) &&
         ((0x100003e00U >> ((ulong)(byte)*input->ptr_ & 0x3f) & 1) != 0))) {
    StringPiece::remove_prefix(input,1);
  }
  while( true ) {
    if (lVar2 == 0) {
      return;
    }
    bVar1 = StringPiece::operator[](input,lVar2 + -1);
    if (0x20 < bVar1) break;
    if ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
      return;
    }
    StringPiece::remove_suffix(input,1);
    lVar2 = input->length_;
  }
  return;
}

Assistant:

void StringPieceTrimWhitespace(StringPiece* input) {
  while (!input->empty() && ascii_isspace(*input->data())) {
    input->remove_prefix(1);
  }
  while (!input->empty() && ascii_isspace((*input)[input->length() - 1])) {
    input->remove_suffix(1);
  }
}